

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_lifetime_analyzer.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnLifetimeAnalyzer::VisitOperator(ColumnLifetimeAnalyzer *this,LogicalOperator *op)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *pvVar1;
  LogicalOperatorType LVar2;
  bool bVar3;
  reference pvVar4;
  pointer pLVar5;
  type pLVar6;
  LogicalOrder *pLVar7;
  LogicalFilter *pLVar8;
  uint uVar9;
  column_binding_set_t lhs_unused;
  column_binding_set_t rhs_unused;
  idx_t has_range;
  undefined1 local_138 [32];
  _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_118;
  vector<duckdb::ColumnBinding,_true> local_e0;
  undefined1 local_c8 [56];
  vector<duckdb::ColumnBinding,_true> local_90;
  vector<duckdb::ColumnBinding,_true> local_78;
  vector<duckdb::ColumnBinding,_true> local_60;
  vector<duckdb::ColumnBinding,_true> local_48;
  idx_t local_30;
  
  bVar3 = TopN::CanOptimize(op);
  if (bVar3) {
    pvVar1 = &op->children;
    pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::operator[](pvVar1,0);
    pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(pvVar4);
    if (pLVar5->type == LOGICAL_ORDER_BY) {
      LogicalOperatorVisitor::VisitOperatorExpressions(&this->super_LogicalOperatorVisitor,op);
      pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](pvVar1,0);
      pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator*(pvVar4);
      LogicalOperatorVisitor::VisitOperatorExpressions(&this->super_LogicalOperatorVisitor,pLVar6);
      pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](pvVar1,0);
      pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar4);
      pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](&pLVar5->children,0);
      pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator*(pvVar4);
      LogicalOperatorVisitor::VisitOperatorExpressions(&this->super_LogicalOperatorVisitor,pLVar6);
      LogicalOperatorVisitor::VisitOperatorChildren(&this->super_LogicalOperatorVisitor,pLVar6);
      return;
    }
  }
  LVar2 = op->type;
  uVar9 = LVar2 - 0x33;
  if (uVar9 < 0x34) {
    if ((0xe00001f000000U >> ((ulong)uVar9 & 0x3f) & 1) == 0) {
      if ((0x23UL >> ((ulong)uVar9 & 0x3f) & 1) != 0) {
        if (this->everything_referenced == false) {
          local_30 = 0;
          bVar3 = LogicalComparisonJoin::HasEquality((LogicalComparisonJoin *)op,&local_30);
          if (!bVar3) {
            return;
          }
          if ((this->optimizer->context->config).prefer_range_joins != false) {
            return;
          }
          local_138._0_8_ = &local_118._M_before_begin;
          local_138._8_8_ = 1;
          local_138._16_8_ = (_Hash_node_base *)0x0;
          local_138._24_8_ = 0;
          local_118._M_buckets = (__buckets_ptr)CONCAT44(local_118._M_buckets._4_4_,1.0);
          local_118._M_bucket_count = 0;
          local_118._M_before_begin._M_nxt = (__node_base_ptr)0x0;
          local_c8._0_8_ = local_c8 + 0x30;
          local_c8._8_8_ = &DAT_00000001;
          local_c8._16_8_ = (_Hash_node_base *)0x0;
          local_c8._24_8_ = 0;
          local_c8._32_4_ = 1.0;
          local_c8._40_8_ = 0;
          local_c8._48_8_ = (__node_base_ptr)0x0;
          pvVar1 = &op->children;
          pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                   ::operator[](pvVar1,0);
          pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                   ::operator->(pvVar4);
          (*pLVar5->_vptr_LogicalOperator[2])(&local_e0,pLVar5);
          ExtractUnusedColumnBindings(this,&local_e0,(column_binding_set_t *)local_138);
          if (local_e0.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e0.
                            super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                            .
                            super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                   ::operator[](pvVar1,1);
          pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                   ::operator->(pvVar4);
          (*pLVar5->_vptr_LogicalOperator[2])(&local_e0,pLVar5);
          ExtractUnusedColumnBindings(this,&local_e0,(column_binding_set_t *)local_c8);
          if (local_e0.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e0.
                            super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                            .
                            super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          LogicalOperatorVisitor::VisitOperatorExpressions(&this->super_LogicalOperatorVisitor,op);
          LogicalOperatorVisitor::VisitOperatorChildren(&this->super_LogicalOperatorVisitor,op);
          if (op->type != LOGICAL_ASOF_JOIN) {
            pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                     ::operator[](pvVar1,0);
            pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                     ::operator->(pvVar4);
            (*pLVar5->_vptr_LogicalOperator[2])(&local_48,pLVar5);
            GenerateProjectionMap
                      (&local_48,(column_binding_set_t *)local_138,
                       (vector<unsigned_long,_true> *)&op[1].type);
            if (local_48.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                .super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_48.
                              super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                              .
                              super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                   ::operator[](pvVar1,1);
          pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                   ::operator->(pvVar4);
          (*pLVar5->_vptr_LogicalOperator[2])(&local_60,pLVar5);
          GenerateProjectionMap
                    (&local_60,(column_binding_set_t *)local_c8,
                     (vector<unsigned_long,_true> *)
                     &op[1].children.
                      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (local_60.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.
                            super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                            .
                            super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          ::std::
          _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable((_Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)local_c8);
          goto LAB_0117c23b;
        }
        goto switchD_0117bfae_caseD_4;
      }
      goto code_r0x0117bfa0;
    }
LAB_0117bd50:
    local_138._0_8_ = &PTR__ColumnLifetimeAnalyzer_02494228;
    local_138._8_8_ = this->optimizer;
    local_138._16_8_ = this->root;
    local_138[0x18] = 1;
    local_118._M_buckets = &local_118._M_single_bucket;
    local_118._M_bucket_count = 1;
    local_118._M_before_begin._M_nxt = (__node_base_ptr)0x0;
    local_118._M_element_count = 0;
    local_118._M_rehash_policy._M_max_load_factor = 1.0;
    local_118._M_rehash_policy._M_next_resize = 0;
    local_118._M_single_bucket = (__node_base_ptr)0x0;
    LogicalOperatorVisitor::VisitOperatorExpressions((LogicalOperatorVisitor *)local_138,op);
    LogicalOperatorVisitor::VisitOperatorChildren((LogicalOperatorVisitor *)local_138,op);
    goto LAB_0117bdac;
  }
code_r0x0117bfa0:
  switch(LVar2) {
  case LOGICAL_PROJECTION:
    local_138._0_8_ = &PTR__ColumnLifetimeAnalyzer_02494228;
    local_138._8_8_ = this->optimizer;
    local_138._16_8_ = this->root;
    local_138._24_8_ = (ulong)(uint7)local_138._25_7_ << 8;
    local_118._M_buckets = &local_118._M_single_bucket;
    local_118._M_bucket_count = 1;
    local_118._M_before_begin._M_nxt = (__node_base_ptr)0x0;
    local_118._M_element_count = 0;
    local_118._M_rehash_policy._M_max_load_factor = 1.0;
    local_118._M_rehash_policy._M_next_resize = 0;
    local_118._M_single_bucket = (__node_base_ptr)0x0;
    LogicalOperatorVisitor::VisitOperatorExpressions((LogicalOperatorVisitor *)local_138,op);
    LogicalOperatorVisitor::VisitOperatorChildren((LogicalOperatorVisitor *)local_138,op);
    goto LAB_0117bdac;
  case LOGICAL_FILTER:
    pLVar8 = LogicalOperator::Cast<duckdb::LogicalFilter>(op);
    if (this->everything_referenced != false) goto switchD_0117bfae_caseD_4;
    local_138._0_8_ = &local_118._M_before_begin;
    local_138._8_8_ = 1;
    local_138._16_8_ = (_Hash_node_base *)0x0;
    local_138._24_8_ = 0;
    local_118._M_buckets = (__buckets_ptr)CONCAT44(local_118._M_buckets._4_4_,1.0);
    local_118._M_bucket_count = 0;
    local_118._M_before_begin._M_nxt = (__node_base_ptr)0x0;
    pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::operator[](&op->children,0);
    pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(pvVar4);
    (*pLVar5->_vptr_LogicalOperator[2])(local_c8,pLVar5);
    ExtractUnusedColumnBindings
              (this,(vector<duckdb::ColumnBinding,_true> *)local_c8,
               (column_binding_set_t *)local_138);
    if ((pointer)local_c8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_c8._0_8_);
    }
    LogicalOperatorVisitor::VisitOperatorExpressions(&this->super_LogicalOperatorVisitor,op);
    LogicalOperatorVisitor::VisitOperatorChildren(&this->super_LogicalOperatorVisitor,op);
    pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::operator[](&op->children,0);
    pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(pvVar4);
    (*pLVar5->_vptr_LogicalOperator[2])(&local_90,pLVar5);
    GenerateProjectionMap(&local_90,(column_binding_set_t *)local_138,&pLVar8->projection_map);
    local_78.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_90.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
         super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
         super__Vector_impl_data._M_start;
    break;
  case LOGICAL_AGGREGATE_AND_GROUP_BY:
    local_138._0_8_ = &PTR__ColumnLifetimeAnalyzer_02494228;
    local_138._8_8_ = this->optimizer;
    local_138._16_8_ = this->root;
    local_138._24_8_ = (ulong)(uint7)local_138._25_7_ << 8;
    local_118._M_buckets = &local_118._M_single_bucket;
    local_118._M_bucket_count = 1;
    local_118._M_before_begin._M_nxt = (__node_base_ptr)0x0;
    local_118._M_element_count = 0;
    local_118._M_rehash_policy._M_max_load_factor = 1.0;
    local_118._M_rehash_policy._M_next_resize = 0;
    local_118._M_single_bucket = (__node_base_ptr)0x0;
    LogicalOperatorVisitor::VisitOperatorExpressions((LogicalOperatorVisitor *)local_138,op);
    LogicalOperatorVisitor::VisitOperatorChildren((LogicalOperatorVisitor *)local_138,op);
LAB_0117bdac:
    local_138._0_8_ = &PTR__ColumnLifetimeAnalyzer_02494228;
    ::std::
    _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_118);
    return;
  case LOGICAL_WINDOW:
  case LOGICAL_UNNEST:
  case LOGICAL_LIMIT:
  case LOGICAL_TOP_N:
  case LOGICAL_TOP_N|LOGICAL_PROJECTION:
  case LOGICAL_COPY_TO_FILE:
    goto switchD_0117bfae_caseD_4;
  case LOGICAL_ORDER_BY:
    pLVar7 = LogicalOperator::Cast<duckdb::LogicalOrder>(op);
    if (this->everything_referenced != false) goto switchD_0117bfae_caseD_4;
    local_138._0_8_ = &local_118._M_before_begin;
    local_138._8_8_ = 1;
    local_138._16_8_ = (_Hash_node_base *)0x0;
    local_138._24_8_ = 0;
    local_118._M_buckets = (__buckets_ptr)CONCAT44(local_118._M_buckets._4_4_,1.0);
    local_118._M_bucket_count = 0;
    local_118._M_before_begin._M_nxt = (__node_base_ptr)0x0;
    pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::operator[](&op->children,0);
    pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(pvVar4);
    (*pLVar5->_vptr_LogicalOperator[2])(local_c8,pLVar5);
    ExtractUnusedColumnBindings
              (this,(vector<duckdb::ColumnBinding,_true> *)local_c8,
               (column_binding_set_t *)local_138);
    if ((pointer)local_c8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_c8._0_8_);
    }
    LogicalOperatorVisitor::VisitOperatorExpressions(&this->super_LogicalOperatorVisitor,op);
    LogicalOperatorVisitor::VisitOperatorChildren(&this->super_LogicalOperatorVisitor,op);
    pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::operator[](&op->children,0);
    pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(pvVar4);
    (*pLVar5->_vptr_LogicalOperator[2])(&local_78,pLVar5);
    GenerateProjectionMap(&local_78,(column_binding_set_t *)local_138,&pLVar7->projection_map);
    break;
  case LOGICAL_DISTINCT:
    this->everything_referenced = true;
    goto switchD_0117bfae_caseD_4;
  default:
    if (LVar2 != LOGICAL_GET) goto switchD_0117bfae_caseD_4;
    goto LAB_0117bd50;
  }
  if (local_78.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0117c23b:
  ::std::
  _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_138);
  return;
switchD_0117bfae_caseD_4:
  LogicalOperatorVisitor::VisitOperatorExpressions(&this->super_LogicalOperatorVisitor,op);
  LogicalOperatorVisitor::VisitOperatorChildren(&this->super_LogicalOperatorVisitor,op);
  return;
}

Assistant:

void ColumnLifetimeAnalyzer::VisitOperator(LogicalOperator &op) {
	Verify(op);
	if (TopN::CanOptimize(op) && op.children[0]->type == LogicalOperatorType::LOGICAL_ORDER_BY) {
		// Let's not mess with this, TopN is more important than projection maps
		// TopN does not support a projection map like Order does
		VisitOperatorExpressions(op);                        // Visit LIMIT
		VisitOperatorExpressions(*op.children[0]);           // Visit ORDER
		StandardVisitOperator(*op.children[0]->children[0]); // Recurse into child of ORDER
		return;
	}
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_AGGREGATE_AND_GROUP_BY: {
		// FIXME: groups that are not referenced can be removed from projection
		// recurse into the children of the aggregate
		ColumnLifetimeAnalyzer analyzer(optimizer, root);
		analyzer.StandardVisitOperator(op);
		return;
	}
	case LogicalOperatorType::LOGICAL_ASOF_JOIN:
	case LogicalOperatorType::LOGICAL_DELIM_JOIN:
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN: {
		auto &comp_join = op.Cast<LogicalComparisonJoin>();
		if (everything_referenced) {
			break;
		}

		// FIXME: for now, we only push into the projection map for equality (hash) joins
		idx_t has_range = 0;
		if (!comp_join.HasEquality(has_range) || optimizer.context.config.prefer_range_joins) {
			return;
		}

		column_binding_set_t lhs_unused;
		column_binding_set_t rhs_unused;
		ExtractUnusedColumnBindings(op.children[0]->GetColumnBindings(), lhs_unused);
		ExtractUnusedColumnBindings(op.children[1]->GetColumnBindings(), rhs_unused);

		StandardVisitOperator(op);

		// then generate the projection map
		if (op.type != LogicalOperatorType::LOGICAL_ASOF_JOIN) {
			// FIXME: left_projection_map in ASOF join
			GenerateProjectionMap(op.children[0]->GetColumnBindings(), lhs_unused, comp_join.left_projection_map);
		}
		GenerateProjectionMap(op.children[1]->GetColumnBindings(), rhs_unused, comp_join.right_projection_map);
		return;
	}
	case LogicalOperatorType::LOGICAL_INSERT:
	case LogicalOperatorType::LOGICAL_UPDATE:
	case LogicalOperatorType::LOGICAL_DELETE:
		//! When RETURNING is used, a PROJECTION is the top level operator for INSERTS, UPDATES, and DELETES
		//! We still need to project all values from these operators so the projection
		//! on top of them can select from only the table values being inserted.
	case LogicalOperatorType::LOGICAL_GET:
	case LogicalOperatorType::LOGICAL_UNION:
	case LogicalOperatorType::LOGICAL_EXCEPT:
	case LogicalOperatorType::LOGICAL_INTERSECT:
	case LogicalOperatorType::LOGICAL_RECURSIVE_CTE:
	case LogicalOperatorType::LOGICAL_MATERIALIZED_CTE: {
		// for set operations/materialized CTEs we don't remove anything, just recursively visit the children
		// FIXME: for UNION we can remove unreferenced columns as long as everything_referenced is false (i.e. we
		// encounter a UNION node that is not preceded by a DISTINCT)
		ColumnLifetimeAnalyzer analyzer(optimizer, root, true);
		analyzer.StandardVisitOperator(op);
		return;
	}
	case LogicalOperatorType::LOGICAL_PROJECTION: {
		// then recurse into the children of this projection
		ColumnLifetimeAnalyzer analyzer(optimizer, root);
		analyzer.StandardVisitOperator(op);
		return;
	}
	case LogicalOperatorType::LOGICAL_ORDER_BY: {
		auto &order = op.Cast<LogicalOrder>();
		if (everything_referenced) {
			break;
		}

		column_binding_set_t unused_bindings;
		ExtractUnusedColumnBindings(op.children[0]->GetColumnBindings(), unused_bindings);

		StandardVisitOperator(op);

		GenerateProjectionMap(op.children[0]->GetColumnBindings(), unused_bindings, order.projection_map);
		return;
	}
	case LogicalOperatorType::LOGICAL_DISTINCT: {
		// distinct, all projected columns are used for the DISTINCT computation
		// mark all columns as used and continue to the children
		// FIXME: DISTINCT with expression list does not implicitly reference everything
		everything_referenced = true;
		break;
	}
	case LogicalOperatorType::LOGICAL_FILTER: {
		auto &filter = op.Cast<LogicalFilter>();
		if (everything_referenced) {
			break;
		}

		// filter, figure out which columns are not needed after the filter
		column_binding_set_t unused_bindings;
		ExtractUnusedColumnBindings(op.children[0]->GetColumnBindings(), unused_bindings);

		StandardVisitOperator(op);

		// then generate the projection map
		GenerateProjectionMap(op.children[0]->GetColumnBindings(), unused_bindings, filter.projection_map);

		return;
	}
	default:
		break;
	}
	StandardVisitOperator(op);
}